

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_s12.c
# Opt level: O3

void s12h_set_ext_params(xc_func_type *p,double *ext_params)

{
  int iVar1;
  void *pvVar2;
  double *pdVar3;
  ulong uVar4;
  
  iVar1 = (p->info->ext_params).n;
  if ((iVar1 - 3U != 0) && (3 < iVar1)) {
    pvVar2 = p->params;
    pdVar3 = p->ext_params;
    uVar4 = 0;
    do {
      *(double *)((long)pvVar2 + uVar4 * 8) = pdVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (iVar1 - 3U != uVar4);
  }
  pdVar3 = p->ext_params;
  p->cam_alpha = pdVar3[(long)iVar1 + -3];
  p->cam_beta = pdVar3[(long)iVar1 + -2];
  p->cam_omega = pdVar3[(long)iVar1 + -1];
  return;
}

Assistant:

static void
s12h_set_ext_params(xc_func_type *p, const double *ext_params)
{
  gga_x_s12_params *params;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_s12_params *) (p->params);

  params->A    = get_ext_param(p, ext_params, 0);
  params->B    = get_ext_param(p, ext_params, 1);
  params->C    = get_ext_param(p, ext_params, 2);
  params->D    = get_ext_param(p, ext_params, 3);
  params->E    = get_ext_param(p, ext_params, 4);

  p->cam_alpha = get_ext_param(p, ext_params, 5);
  params->bx   = 1.0 - p->cam_alpha;
}